

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

CPpmd_See * Ppmd7_MakeEscFreq(CPpmd7 *p,uint numMasked,UInt32 *escFreq)

{
  uint uVar1;
  int iVar2;
  uint r;
  uint nonMasked;
  CPpmd_See *see;
  UInt32 *escFreq_local;
  uint numMasked_local;
  CPpmd7 *p_local;
  
  uVar1 = p->MinContext->NumStats - numMasked;
  if (p->MinContext->NumStats == 0x100) {
    _r = &p->DummySee;
    *escFreq = 1;
  }
  else {
    _r = p->See[p->NS2Indx[uVar1 - 1]] +
         (long)(int)(uint)(uVar1 < (uint)*(ushort *)(p->Base + p->MinContext->Suffix) -
                                   (uint)p->MinContext->NumStats) +
         (long)(int)((uint)((uint)p->MinContext->SummFreq < (uint)p->MinContext->NumStats * 0xb) <<
                    1) + (long)(int)((uint)(uVar1 < numMasked) << 2) + (ulong)p->HiBitsFlag;
    iVar2 = (int)(uint)_r->Summ >> (_r->Shift & 0x1f);
    _r->Summ = _r->Summ - (short)iVar2;
    *escFreq = iVar2 + (uint)(iVar2 == 0);
  }
  return _r;
}

Assistant:

static CPpmd_See *Ppmd7_MakeEscFreq(CPpmd7 *p, unsigned numMasked, UInt32 *escFreq)
{
  CPpmd_See *see;
  unsigned nonMasked = p->MinContext->NumStats - numMasked;
  if (p->MinContext->NumStats != 256)
  {
    see = p->See[p->NS2Indx[nonMasked - 1]] +
        (nonMasked < (unsigned)SUFFIX(p->MinContext)->NumStats - p->MinContext->NumStats) +
        2 * (p->MinContext->SummFreq < 11 * p->MinContext->NumStats) +
        4 * (numMasked > nonMasked) +
        p->HiBitsFlag;
    {
      unsigned r = (see->Summ >> see->Shift);
      see->Summ = (UInt16)(see->Summ - r);
      *escFreq = r + (r == 0);
    }
  }
  else
  {
    see = &p->DummySee;
    *escFreq = 1;
  }
  return see;
}